

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O3

DecodeStatus DecodeVSTInstruction(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  uint uVar1;
  uint uVar2;
  DecodeStatus DVar3;
  int iVar4;
  uint16_t *puVar5;
  uint64_t extraout_RDX;
  uint64_t extraout_RDX_00;
  uint64_t uVar6;
  uint64_t extraout_RDX_01;
  uint uVar7;
  uint uVar8;
  
  uVar7 = Insn >> 0x10 & 0xf;
  uVar8 = Insn & 0xf;
  uVar2 = MCInst_getOpcode(Inst);
  uVar6 = extraout_RDX;
  if (uVar2 - 0x768 < 0x7b) {
    puVar5 = (uint16_t *)
             ((long)&switchD_001e63ca::switchdataD_0035c610 +
             (long)(int)(&switchD_001e63ca::switchdataD_0035c610)[uVar2 - 0x768]);
    switch(uVar2) {
    case 0x768:
    case 0x769:
    case 0x76b:
    case 0x76c:
    case 0x76d:
    case 0x76e:
    case 0x771:
    case 0x772:
    case 0x774:
    case 0x775:
    case 0x776:
    case 0x777:
    case 0x77d:
    case 0x77e:
    case 0x783:
    case 0x784:
    case 0x785:
    case 0x786:
    case 0x789:
    case 0x78a:
    case 0x78c:
    case 0x78d:
    case 0x78e:
    case 0x78f:
    case 0x791:
    case 0x792:
    case 0x794:
    case 0x795:
    case 0x797:
    case 0x798:
    case 0x79a:
    case 0x79b:
    case 0x7c0:
    case 0x7c1:
    case 0x7c3:
    case 0x7c4:
    case 0x7c6:
    case 0x7c7:
    case 0x7c9:
    case 0x7ca:
    case 0x7cc:
    case 0x7cd:
    case 1999:
    case 2000:
    case 0x7d5:
    case 0x7d6:
    case 0x7db:
    case 0x7dc:
    case 0x7e1:
    case 0x7e2:
      if (uVar8 == 0xf) {
        return MCDisassembler_Fail;
      }
      MCOperand_CreateImm0(Inst,0);
      uVar6 = extraout_RDX_00;
    }
  }
  else {
    uVar1 = uVar2 - 0x809;
    puVar5 = (uint16_t *)(ulong)uVar1;
    if (((uVar1 < 0x1f) && (uVar6 = 0x42100111, (0x42100111U >> (uVar1 & 0x1f) & 1) != 0)) ||
       ((uVar2 - 0x859 < 0x1f &&
        (puVar5 = (uint16_t *)0x42100111, (0x42100111U >> (uVar2 - 0x859 & 0x1f) & 1) != 0)))) {
      puVar5 = GPRDecoderTable;
      MCOperand_CreateReg0(Inst,(uint)GPRDecoderTable[uVar7]);
      uVar6 = extraout_RDX_01;
    }
  }
  DVar3 = DecodeAddrMode6Operand(Inst,uVar7 | Insn & 0x30,uVar6,puVar5);
  if ((DVar3 | 2) != MCDisassembler_Success) {
    return MCDisassembler_Fail;
  }
  uVar2 = MCInst_getOpcode(Inst);
  if (((0x32 < uVar2 - 0x768) || ((0x4925228205229U >> ((ulong)(uVar2 - 0x768) & 0x3f) & 1) == 0))
     && ((0x21 < uVar2 - 0x7c0 || ((0x208209249U >> ((ulong)(uVar2 - 0x7c0) & 0x3f) & 1) == 0)))) {
    if (uVar8 == 0xd) {
      uVar2 = 0;
    }
    else {
      if (uVar8 == 0xf) goto LAB_001e64a0;
      uVar2 = (uint)GPRDecoderTable[uVar8];
    }
    MCOperand_CreateReg0(Inst,uVar2);
  }
LAB_001e64a0:
  uVar7 = Insn >> 0xc & 0xf | Insn >> 0x12 & 0x10;
  uVar2 = MCInst_getOpcode(Inst);
  if (uVar2 - 0x790 < 0xc) {
LAB_001e64cf:
    if (uVar7 == 0x1f) {
      return MCDisassembler_Fail;
    }
    puVar5 = DPairDecoderTable;
  }
  else if (uVar2 - 0x7bf < 9) {
    if (0x1d < uVar7) {
      return MCDisassembler_Fail;
    }
    puVar5 = DPairSpacedDecoderTable;
  }
  else {
    if (uVar2 - 0x7c8 < 9) goto LAB_001e64cf;
    puVar5 = DPRDecoderTable;
  }
  MCOperand_CreateReg0(Inst,(uint)puVar5[uVar7]);
  uVar8 = MCInst_getOpcode(Inst);
  iVar4 = 1;
  uVar2 = uVar8 - 0x806;
  if (uVar2 < 0x22) {
    if ((0x999UL >> ((ulong)uVar2 & 0x3f) & 1) == 0) {
      if ((0x294a00000U >> ((ulong)uVar2 & 0x3f) & 1) == 0) goto LAB_001e653b;
LAB_001e6560:
      iVar4 = 2;
    }
LAB_001e6565:
    MCOperand_CreateReg0(Inst,(uint)DPRDecoderTable[iVar4 + uVar7 & 0x1f]);
  }
  else {
LAB_001e653b:
    uVar8 = uVar8 - 0x856;
    if (uVar8 < 0x22) {
      if ((0x999UL >> ((ulong)uVar8 & 0x3f) & 1) != 0) goto LAB_001e6565;
      if ((0x294a00000U >> ((ulong)uVar8 & 0x3f) & 1) != 0) goto LAB_001e6560;
    }
  }
  uVar8 = MCInst_getOpcode(Inst);
  iVar4 = 2;
  uVar2 = uVar8 - 0x806;
  if (uVar2 < 0x22) {
    if ((0x999UL >> ((ulong)uVar2 & 0x3f) & 1) == 0) {
      if ((0x294a00000U >> ((ulong)uVar2 & 0x3f) & 1) == 0) goto LAB_001e65b1;
LAB_001e65d6:
      iVar4 = 4;
    }
  }
  else {
LAB_001e65b1:
    uVar8 = uVar8 - 0x856;
    if (0x21 < uVar8) goto LAB_001e65f4;
    if ((0x999UL >> ((ulong)uVar8 & 0x3f) & 1) == 0) {
      if ((0x294a00000U >> ((ulong)uVar8 & 0x3f) & 1) == 0) goto LAB_001e65f4;
      goto LAB_001e65d6;
    }
  }
  MCOperand_CreateReg0(Inst,(uint)DPRDecoderTable[iVar4 + uVar7 & 0x1f]);
LAB_001e65f4:
  uVar2 = MCInst_getOpcode(Inst);
  uVar2 = uVar2 - 0x856;
  if (uVar2 < 0x22) {
    iVar4 = 3;
    if ((0x999UL >> ((ulong)uVar2 & 0x3f) & 1) == 0) {
      if ((0x294a00000U >> ((ulong)uVar2 & 0x3f) & 1) == 0) {
        return DVar3;
      }
      iVar4 = 6;
    }
    MCOperand_CreateReg0(Inst,(uint)DPRDecoderTable[uVar7 + iVar4 & 0x1f]);
  }
  return DVar3;
}

Assistant:

static DecodeStatus DecodeVSTInstruction(MCInst *Inst, unsigned Insn,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;
	unsigned wb, Rn, Rm;
	unsigned Rd = fieldFromInstruction_4(Insn, 12, 4);
	Rd |= fieldFromInstruction_4(Insn, 22, 1) << 4;
	wb = fieldFromInstruction_4(Insn, 16, 4);
	Rn = fieldFromInstruction_4(Insn, 16, 4);
	Rn |= fieldFromInstruction_4(Insn, 4, 2) << 4;
	Rm = fieldFromInstruction_4(Insn, 0, 4);

	// Writeback Operand
	switch (MCInst_getOpcode(Inst)) {
		case ARM_VST1d8wb_fixed:
		case ARM_VST1d16wb_fixed:
		case ARM_VST1d32wb_fixed:
		case ARM_VST1d64wb_fixed:
		case ARM_VST1d8wb_register:
		case ARM_VST1d16wb_register:
		case ARM_VST1d32wb_register:
		case ARM_VST1d64wb_register:
		case ARM_VST1q8wb_fixed:
		case ARM_VST1q16wb_fixed:
		case ARM_VST1q32wb_fixed:
		case ARM_VST1q64wb_fixed:
		case ARM_VST1q8wb_register:
		case ARM_VST1q16wb_register:
		case ARM_VST1q32wb_register:
		case ARM_VST1q64wb_register:
		case ARM_VST1d8Twb_fixed:
		case ARM_VST1d16Twb_fixed:
		case ARM_VST1d32Twb_fixed:
		case ARM_VST1d64Twb_fixed:
		case ARM_VST1d8Twb_register:
		case ARM_VST1d16Twb_register:
		case ARM_VST1d32Twb_register:
		case ARM_VST1d64Twb_register:
		case ARM_VST1d8Qwb_fixed:
		case ARM_VST1d16Qwb_fixed:
		case ARM_VST1d32Qwb_fixed:
		case ARM_VST1d64Qwb_fixed:
		case ARM_VST1d8Qwb_register:
		case ARM_VST1d16Qwb_register:
		case ARM_VST1d32Qwb_register:
		case ARM_VST1d64Qwb_register:
		case ARM_VST2d8wb_fixed:
		case ARM_VST2d16wb_fixed:
		case ARM_VST2d32wb_fixed:
		case ARM_VST2d8wb_register:
		case ARM_VST2d16wb_register:
		case ARM_VST2d32wb_register:
		case ARM_VST2q8wb_fixed:
		case ARM_VST2q16wb_fixed:
		case ARM_VST2q32wb_fixed:
		case ARM_VST2q8wb_register:
		case ARM_VST2q16wb_register:
		case ARM_VST2q32wb_register:
		case ARM_VST2b8wb_fixed:
		case ARM_VST2b16wb_fixed:
		case ARM_VST2b32wb_fixed:
		case ARM_VST2b8wb_register:
		case ARM_VST2b16wb_register:
		case ARM_VST2b32wb_register:
			if (Rm == 0xF)
				return MCDisassembler_Fail;
			MCOperand_CreateImm0(Inst, 0);
			break;
		case ARM_VST3d8_UPD:
		case ARM_VST3d16_UPD:
		case ARM_VST3d32_UPD:
		case ARM_VST3q8_UPD:
		case ARM_VST3q16_UPD:
		case ARM_VST3q32_UPD:
		case ARM_VST4d8_UPD:
		case ARM_VST4d16_UPD:
		case ARM_VST4d32_UPD:
		case ARM_VST4q8_UPD:
		case ARM_VST4q16_UPD:
		case ARM_VST4q32_UPD:
			if (!Check(&S, DecodeGPRRegisterClass(Inst, wb, Address, Decoder)))
				return MCDisassembler_Fail;
			break;
		default:
			break;
	}

	// AddrMode6 Base (register+alignment)
	if (!Check(&S, DecodeAddrMode6Operand(Inst, Rn, Address, Decoder)))
		return MCDisassembler_Fail;

	// AddrMode6 Offset (register)
	switch (MCInst_getOpcode(Inst)) {
		default:
			if (Rm == 0xD)
				MCOperand_CreateReg0(Inst, 0);
			else if (Rm != 0xF) {
				if (!Check(&S, DecodeGPRRegisterClass(Inst, Rm, Address, Decoder)))
					return MCDisassembler_Fail;
			}
			break;
		case ARM_VST1d8wb_fixed:
		case ARM_VST1d16wb_fixed:
		case ARM_VST1d32wb_fixed:
		case ARM_VST1d64wb_fixed:
		case ARM_VST1q8wb_fixed:
		case ARM_VST1q16wb_fixed:
		case ARM_VST1q32wb_fixed:
		case ARM_VST1q64wb_fixed:
		case ARM_VST1d8Twb_fixed:
		case ARM_VST1d16Twb_fixed:
		case ARM_VST1d32Twb_fixed:
		case ARM_VST1d64Twb_fixed:
		case ARM_VST1d8Qwb_fixed:
		case ARM_VST1d16Qwb_fixed:
		case ARM_VST1d32Qwb_fixed:
		case ARM_VST1d64Qwb_fixed:
		case ARM_VST2d8wb_fixed:
		case ARM_VST2d16wb_fixed:
		case ARM_VST2d32wb_fixed:
		case ARM_VST2q8wb_fixed:
		case ARM_VST2q16wb_fixed:
		case ARM_VST2q32wb_fixed:
		case ARM_VST2b8wb_fixed:
		case ARM_VST2b16wb_fixed:
		case ARM_VST2b32wb_fixed:
			break;
	}


	// First input register
	switch (MCInst_getOpcode(Inst)) {
		case ARM_VST1q16:
		case ARM_VST1q32:
		case ARM_VST1q64:
		case ARM_VST1q8:
		case ARM_VST1q16wb_fixed:
		case ARM_VST1q16wb_register:
		case ARM_VST1q32wb_fixed:
		case ARM_VST1q32wb_register:
		case ARM_VST1q64wb_fixed:
		case ARM_VST1q64wb_register:
		case ARM_VST1q8wb_fixed:
		case ARM_VST1q8wb_register:
		case ARM_VST2d16:
		case ARM_VST2d32:
		case ARM_VST2d8:
		case ARM_VST2d16wb_fixed:
		case ARM_VST2d16wb_register:
		case ARM_VST2d32wb_fixed:
		case ARM_VST2d32wb_register:
		case ARM_VST2d8wb_fixed:
		case ARM_VST2d8wb_register:
			if (!Check(&S, DecodeDPairRegisterClass(Inst, Rd, Address, Decoder)))
				return MCDisassembler_Fail;
			break;
		case ARM_VST2b16:
		case ARM_VST2b32:
		case ARM_VST2b8:
		case ARM_VST2b16wb_fixed:
		case ARM_VST2b16wb_register:
		case ARM_VST2b32wb_fixed:
		case ARM_VST2b32wb_register:
		case ARM_VST2b8wb_fixed:
		case ARM_VST2b8wb_register:
			if (!Check(&S, DecodeDPairSpacedRegisterClass(Inst, Rd, Address, Decoder)))
				return MCDisassembler_Fail;
			break;
		default:
			if (!Check(&S, DecodeDPRRegisterClass(Inst, Rd, Address, Decoder)))
				return MCDisassembler_Fail;
	}

	// Second input register
	switch (MCInst_getOpcode(Inst)) {
		case ARM_VST3d8:
		case ARM_VST3d16:
		case ARM_VST3d32:
		case ARM_VST3d8_UPD:
		case ARM_VST3d16_UPD:
		case ARM_VST3d32_UPD:
		case ARM_VST4d8:
		case ARM_VST4d16:
		case ARM_VST4d32:
		case ARM_VST4d8_UPD:
		case ARM_VST4d16_UPD:
		case ARM_VST4d32_UPD:
			if (!Check(&S, DecodeDPRRegisterClass(Inst, (Rd+1)%32, Address, Decoder)))
				return MCDisassembler_Fail;
			break;
		case ARM_VST3q8:
		case ARM_VST3q16:
		case ARM_VST3q32:
		case ARM_VST3q8_UPD:
		case ARM_VST3q16_UPD:
		case ARM_VST3q32_UPD:
		case ARM_VST4q8:
		case ARM_VST4q16:
		case ARM_VST4q32:
		case ARM_VST4q8_UPD:
		case ARM_VST4q16_UPD:
		case ARM_VST4q32_UPD:
			if (!Check(&S, DecodeDPRRegisterClass(Inst, (Rd+2)%32, Address, Decoder)))
				return MCDisassembler_Fail;
			break;
		default:
			break;
	}

	// Third input register
	switch (MCInst_getOpcode(Inst)) {
		case ARM_VST3d8:
		case ARM_VST3d16:
		case ARM_VST3d32:
		case ARM_VST3d8_UPD:
		case ARM_VST3d16_UPD:
		case ARM_VST3d32_UPD:
		case ARM_VST4d8:
		case ARM_VST4d16:
		case ARM_VST4d32:
		case ARM_VST4d8_UPD:
		case ARM_VST4d16_UPD:
		case ARM_VST4d32_UPD:
			if (!Check(&S, DecodeDPRRegisterClass(Inst, (Rd+2)%32, Address, Decoder)))
				return MCDisassembler_Fail;
			break;
		case ARM_VST3q8:
		case ARM_VST3q16:
		case ARM_VST3q32:
		case ARM_VST3q8_UPD:
		case ARM_VST3q16_UPD:
		case ARM_VST3q32_UPD:
		case ARM_VST4q8:
		case ARM_VST4q16:
		case ARM_VST4q32:
		case ARM_VST4q8_UPD:
		case ARM_VST4q16_UPD:
		case ARM_VST4q32_UPD:
			if (!Check(&S, DecodeDPRRegisterClass(Inst, (Rd+4)%32, Address, Decoder)))
				return MCDisassembler_Fail;
			break;
		default:
			break;
	}

	// Fourth input register
	switch (MCInst_getOpcode(Inst)) {
		case ARM_VST4d8:
		case ARM_VST4d16:
		case ARM_VST4d32:
		case ARM_VST4d8_UPD:
		case ARM_VST4d16_UPD:
		case ARM_VST4d32_UPD:
			if (!Check(&S, DecodeDPRRegisterClass(Inst, (Rd+3)%32, Address, Decoder)))
				return MCDisassembler_Fail;
			break;
		case ARM_VST4q8:
		case ARM_VST4q16:
		case ARM_VST4q32:
		case ARM_VST4q8_UPD:
		case ARM_VST4q16_UPD:
		case ARM_VST4q32_UPD:
			if (!Check(&S, DecodeDPRRegisterClass(Inst, (Rd+6)%32, Address, Decoder)))
				return MCDisassembler_Fail;
			break;
		default:
			break;
	}

	return S;
}